

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

uint __thiscall o3dgc::Arithmetic_Codec::write_to_file(Arithmetic_Codec *this,FILE *code_file)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint local_28;
  uint local_24;
  int file_byte;
  uint nb;
  uint code_bytes;
  uint header_bytes;
  FILE *code_file_local;
  Arithmetic_Codec *this_local;
  
  nb = 0;
  uVar1 = stop_encoder(this);
  local_24 = uVar1;
  do {
    local_28 = local_24 & 0x7f;
    local_24 = local_24 >> 7;
    if (local_24 != 0) {
      local_28 = local_28 | 0x80;
    }
    iVar2 = putc(local_28,(FILE *)code_file);
    if (iVar2 == -1) {
      AC_Error("cannot write compressed data to file");
    }
    nb = nb + 1;
  } while (local_24 != 0);
  sVar3 = fwrite(this->code_buffer,1,(ulong)uVar1,(FILE *)code_file);
  if (sVar3 != uVar1) {
    AC_Error("cannot write compressed data to file");
  }
  return uVar1 + nb;
}

Assistant:

unsigned Arithmetic_Codec::write_to_file(FILE * code_file)
    {
      unsigned header_bytes = 0, code_bytes = stop_encoder(), nb = code_bytes;

                         // write variable-length header with number of code bytes
      do {
        int file_byte = int(nb & 0x7FU);
        if ((nb >>= 7) > 0) file_byte |= 0x80;
        if (putc(file_byte, code_file) == EOF)
          AC_Error("cannot write compressed data to file");
        header_bytes++;
      } while (nb);
                                                          // write compressed data
      if (fwrite(code_buffer, 1, code_bytes, code_file) != code_bytes)
        AC_Error("cannot write compressed data to file");

      return code_bytes + header_bytes;                              // bytes used
    }